

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O1

void __thiscall
jbcoin::STObject::setFieldUsingAssignment<jbcoin::STAmount>
          (STObject *this,SField *field,STAmount *value)

{
  mantissa_type mVar1;
  int iVar2;
  STBase *pSVar3;
  long lVar4;
  int i;
  long lVar5;
  
  pSVar3 = getPField(this,field,true);
  if (pSVar3 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar2 = (*pSVar3->_vptr_STBase[4])(pSVar3);
  if (iVar2 == 0) {
    pSVar3 = makeFieldPresent(this,field);
  }
  if (pSVar3 == (STBase *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(pSVar3,&STBase::typeinfo,&STAmount::typeinfo,0);
  }
  if (lVar4 != 0) {
    if (**(int **)(lVar4 + 8) < 1) {
      *(SField **)(lVar4 + 8) = (value->super_STBase).fName;
    }
    lVar5 = 0;
    do {
      *(uint32_t *)(lVar4 + 0x10 + lVar5 * 4) = (value->mIssue).currency.pn[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
    lVar5 = 0;
    do {
      *(uint32_t *)(lVar4 + 0x24 + lVar5 * 4) = (value->mIssue).account.pn[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
    mVar1 = value->mValue;
    *(undefined8 *)(lVar4 + 0x3e) = *(undefined8 *)((long)&value->mValue + 6);
    *(mantissa_type *)(lVar4 + 0x38) = mVar1;
    return;
  }
  Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
}

Assistant:

void setFieldUsingAssignment (SField const& field, T const& value)
    {
        STBase* rf = getPField (field, true);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        if (rf->getSType () == STI_NOTPRESENT)
            rf = makeFieldPresent (field);

        T* cf = dynamic_cast<T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        (*cf) = value;
    }